

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu_v2.c
# Opt level: O3

MPP_RET h264e_vepu_prep_get_addr(HalH264eVepuPrep *prep,MppBuffer buffer,RK_U32 (*addr) [3])

{
  size_t sVar1;
  RK_U32 RVar2;
  size_t sVar3;
  ulong uVar4;
  
  RVar2 = mpp_buffer_get_fd_with_caller(buffer,"h264e_vepu_prep_get_addr");
  sVar3 = mpp_buffer_get_size_with_caller(buffer,"h264e_vepu_prep_get_addr");
  if (((byte)hal_h264e_debug & 0x10) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu_v2","enter\n","h264e_vepu_prep_get_addr");
  }
  (*addr)[0] = RVar2;
  (*addr)[1] = RVar2;
  (*addr)[2] = RVar2;
  if (sVar3 < prep->size_y) {
    _mpp_log_l(2,"hal_h264e_vepu_v2",
               "warnning: input buffer size 0x%x is smaller than required size 0x%x",(char *)0x0,
               sVar3);
  }
  sVar1 = prep->size_c;
  if (sVar1 != 0) {
    uVar4 = (ulong)prep->offset_cb;
    if (uVar4 == 0) {
      if (prep->offset_cr == 0) goto LAB_00233317;
    }
    else if (sVar3 < sVar1 + uVar4) {
      _mpp_log_l(2,"hal_h264e_vepu_v2",
                 "warnning: input buffer size 0x%x is smaller than cb requirement 0x%x + 0x%x",
                 (char *)0x0,sVar3,uVar4,sVar1);
    }
    uVar4 = (ulong)prep->offset_cr;
    if ((uVar4 != 0) && (sVar3 < prep->size_c + uVar4)) {
      _mpp_log_l(2,"hal_h264e_vepu_v2",
                 "warnning: input buffer size 0x%x is smaller than cb requirement 0x%x + 0x%x",
                 (char *)0x0,sVar3,uVar4,prep->size_c);
    }
  }
LAB_00233317:
  if (((byte)hal_h264e_debug & 0x10) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu_v2","leave\n","h264e_vepu_prep_get_addr");
  }
  return MPP_OK;
}

Assistant:

MPP_RET h264e_vepu_prep_get_addr(HalH264eVepuPrep *prep, MppBuffer buffer,
                                 RK_U32 (*addr)[3])
{
    RK_U32 fd = (RK_U32)mpp_buffer_get_fd(buffer);
    size_t size = mpp_buffer_get_size(buffer);

    hal_h264e_dbg_buffer("enter\n");

    (*addr)[0] = fd;
    (*addr)[1] = fd;
    (*addr)[2] = fd;

    if (size < prep->size_y)
        mpp_err("warnning: input buffer size 0x%x is smaller than required size 0x%x",
                size, prep->size_y);

    if (prep->size_c && (prep->offset_cb || prep->offset_cr)) {
        if (prep->offset_cb && (size < prep->offset_cb + prep->size_c))
            mpp_err("warnning: input buffer size 0x%x is smaller than cb requirement 0x%x + 0x%x",
                    size, prep->offset_cb, prep->size_c);

        if (prep->offset_cr && (size < prep->offset_cr + prep->size_c))
            mpp_err("warnning: input buffer size 0x%x is smaller than cb requirement 0x%x + 0x%x",
                    size, prep->offset_cr, prep->size_c);
    }

    hal_h264e_dbg_buffer("leave\n");

    return MPP_OK;
}